

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined4 uVar2;
  size_t sVar3;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  NodeRef nodeRef;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  Primitive *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  ulong uVar13;
  NodeRef *pNVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  vint4 ai_2;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vint4 ai;
  undefined1 auVar22 [16];
  vint4 ai_1;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vint4 ai_3;
  undefined1 auVar25 [16];
  vint4 bi;
  undefined1 auVar26 [16];
  vint4 bi_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 bi_3;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 bi_2;
  undefined1 auVar31 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  Precalculations pre;
  vint4 bi_8;
  undefined1 local_3598 [16];
  vbool<4> valid0;
  InstanceIntersectorK<4> local_34e8 [16];
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar21 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
    auVar32 = ZEXT1664(auVar21);
    auVar18 = vpcmpeqd_avx(auVar21,(undefined1  [16])valid_i->field_0);
    auVar20 = ZEXT816(0) << 0x40;
    auVar5 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar20,5);
    auVar17 = auVar18 & auVar5;
    if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar17[0xf] < '\0')
    {
      auVar17 = vandps_avx(auVar5,auVar18);
      auVar33 = ZEXT1664(auVar17);
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar27);
      auVar31._8_4_ = 0x219392ef;
      auVar31._0_8_ = 0x219392ef219392ef;
      auVar31._12_4_ = 0x219392ef;
      auVar5 = vcmpps_avx(auVar5,auVar31,1);
      auVar18 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar31,auVar5);
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar27);
      auVar5 = vcmpps_avx(auVar5,auVar31,1);
      auVar5 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar31,auVar5);
      auVar6 = vrcpps_avx(auVar18);
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = &DAT_3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar23 = vfnmadd213ps_fma(auVar18,auVar6,auVar29);
      auVar35 = vrcpps_avx(auVar5);
      auVar39 = vfnmadd213ps_fma(auVar5,auVar35,auVar29);
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar27);
      auVar5 = vcmpps_avx(auVar5,auVar31,1);
      auVar5 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar31,auVar5);
      auVar18 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar38 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_near[1].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar18,auVar17);
      auVar40 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar18 = vrcpps_avx(auVar5);
      auVar5 = vfnmadd213ps_fma(auVar5,auVar18,auVar29);
      auVar27 = vfmadd132ps_fma(auVar5,auVar18,auVar18);
      auVar37 = ZEXT1664(auVar27);
      auVar5 = *(undefined1 (*) [16])ray;
      auVar20 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar20);
      local_3598._4_4_ = auVar17._4_4_ ^ auVar21._4_4_;
      local_3598._0_4_ = auVar17._0_4_ ^ auVar21._0_4_;
      local_3598._8_4_ = auVar17._8_4_ ^ auVar21._8_4_;
      local_3598._12_4_ = auVar17._12_4_ ^ auVar21._12_4_;
      auVar6 = vfmadd132ps_fma(auVar23,auVar6,auVar6);
      auVar34 = ZEXT1664(auVar6);
      auVar21 = *(undefined1 (*) [16])(ray + 0x10);
      auVar18 = *(undefined1 (*) [16])(ray + 0x20);
      auVar35 = vfmadd132ps_fma(auVar39,auVar35,auVar35);
      auVar36 = ZEXT1664(auVar35);
      auVar23._8_4_ = 0xff800000;
      auVar23._0_8_ = 0xff800000ff800000;
      auVar23._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar23,auVar20,auVar17);
      pNVar14 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar12 = &stack_near[2].field_0;
      auVar17._0_4_ = auVar35._0_4_ * -auVar18._0_4_;
      auVar17._4_4_ = auVar35._4_4_ * -auVar18._4_4_;
      auVar17._8_4_ = auVar35._8_4_ * -auVar18._8_4_;
      auVar17._12_4_ = auVar35._12_4_ * -auVar18._12_4_;
LAB_006386d4:
      auVar18 = auVar32._0_16_;
      paVar12 = paVar12 + -1;
      pNVar1 = pNVar14 + -1;
      pNVar14 = pNVar14 + -1;
      bVar16 = true;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        auVar19 = ZEXT1664((undefined1  [16])*paVar12);
        auVar20 = vcmpps_avx((undefined1  [16])*paVar12,(undefined1  [16])bi_8.field_0,1);
        sVar10 = pNVar1->ptr;
        if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar20[0xf] < '\0') {
          do {
            auVar20 = auVar34._0_16_;
            auVar23 = auVar37._0_16_;
            auVar35 = auVar36._0_16_;
            auVar39 = auVar40._0_16_;
            if ((sVar10 & 8) != 0) {
              if (sVar10 == 0xfffffffffffffff8) goto LAB_00638831;
              auVar29 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar19._0_16_,6);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') {
                uVar9 = (ulong)((uint)sVar10 & 0xf);
                valid0.field_0.i[1] = auVar32._4_4_ ^ local_3598._4_4_;
                valid0.field_0.i[0] = auVar32._0_4_ ^ local_3598._0_4_;
                valid0.field_0.i[2] = auVar32._8_4_ ^ local_3598._8_4_;
                valid0.field_0.i[3] = auVar32._12_4_ ^ local_3598._12_4_;
                if (uVar9 == 8) goto LAB_00638900;
                prim = (Primitive *)(sVar10 & 0xfffffffffffffff0);
                uVar13 = 1;
                goto LAB_006388ac;
              }
              break;
            }
            auVar19 = ZEXT1664(auVar38._0_16_);
            uVar9 = 0;
            sVar11 = 8;
            do {
              sVar3 = *(size_t *)((sVar10 & 0xfffffffffffffff0) + uVar9 * 8);
              if (sVar3 != 8) {
                uVar2 = *(undefined4 *)(sVar10 + 0x40 + uVar9 * 4);
                auVar22._4_4_ = uVar2;
                auVar22._0_4_ = uVar2;
                auVar22._8_4_ = uVar2;
                auVar22._12_4_ = uVar2;
                auVar7._4_4_ = auVar6._4_4_ * -auVar5._4_4_;
                auVar7._0_4_ = auVar6._0_4_ * -auVar5._0_4_;
                auVar7._8_4_ = auVar6._8_4_ * -auVar5._8_4_;
                auVar7._12_4_ = auVar6._12_4_ * -auVar5._12_4_;
                auVar22 = vfmadd213ps_fma(auVar22,auVar20,auVar7);
                uVar2 = *(undefined4 *)(sVar10 + 0x80 + uVar9 * 4);
                auVar24._4_4_ = uVar2;
                auVar24._0_4_ = uVar2;
                auVar24._8_4_ = uVar2;
                auVar24._12_4_ = uVar2;
                auVar8._4_4_ = auVar27._4_4_ * -auVar21._4_4_;
                auVar8._0_4_ = auVar27._0_4_ * -auVar21._0_4_;
                auVar8._8_4_ = auVar27._8_4_ * -auVar21._8_4_;
                auVar8._12_4_ = auVar27._12_4_ * -auVar21._12_4_;
                auVar24 = vfmadd213ps_fma(auVar24,auVar23,auVar8);
                uVar2 = *(undefined4 *)(sVar10 + 0xc0 + uVar9 * 4);
                auVar25._4_4_ = uVar2;
                auVar25._0_4_ = uVar2;
                auVar25._8_4_ = uVar2;
                auVar25._12_4_ = uVar2;
                auVar25 = vfmadd213ps_fma(auVar25,auVar35,auVar17);
                uVar2 = *(undefined4 *)(sVar10 + 0x60 + uVar9 * 4);
                auVar26._4_4_ = uVar2;
                auVar26._0_4_ = uVar2;
                auVar26._8_4_ = uVar2;
                auVar26._12_4_ = uVar2;
                auVar7 = vfmadd213ps_fma(auVar26,auVar20,auVar7);
                uVar2 = *(undefined4 *)(sVar10 + 0xa0 + uVar9 * 4);
                auVar28._4_4_ = uVar2;
                auVar28._0_4_ = uVar2;
                auVar28._8_4_ = uVar2;
                auVar28._12_4_ = uVar2;
                auVar8 = vfmadd213ps_fma(auVar28,auVar23,auVar8);
                uVar2 = *(undefined4 *)(sVar10 + 0xe0 + uVar9 * 4);
                auVar30._4_4_ = uVar2;
                auVar30._0_4_ = uVar2;
                auVar30._8_4_ = uVar2;
                auVar30._12_4_ = uVar2;
                auVar26 = vfmadd213ps_fma(auVar30,auVar35,auVar17);
                auVar29 = vpminsd_avx(auVar22,auVar7);
                auVar31 = vpminsd_avx(auVar24,auVar8);
                auVar29 = vpmaxsd_avx(auVar29,auVar31);
                auVar31 = vpminsd_avx(auVar25,auVar26);
                auVar31 = vpmaxsd_avx(auVar29,auVar31);
                auVar29 = vpmaxsd_avx(auVar22,auVar7);
                auVar22 = vpmaxsd_avx(auVar24,auVar8);
                auVar24 = vpminsd_avx(auVar29,auVar22);
                auVar29 = vpmaxsd_avx(auVar25,auVar26);
                auVar22 = vpmaxsd_avx(auVar31,auVar39);
                auVar29 = vpminsd_avx(auVar29,(undefined1  [16])bi_8.field_0);
                auVar29 = vpminsd_avx(auVar24,auVar29);
                auVar29 = vcmpps_avx(auVar22,auVar29,2);
                if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar29[0xf] < '\0') {
                  auVar29 = vblendvps_avx(auVar38._0_16_,auVar31,auVar29);
                  if (sVar11 != 8) {
                    pNVar14->ptr = sVar11;
                    pNVar14 = pNVar14 + 1;
                    *paVar12 = auVar19._0_16_;
                    paVar12 = paVar12 + 1;
                  }
                  auVar19 = ZEXT1664(auVar29);
                  sVar11 = sVar3;
                }
              }
            } while ((sVar3 != 8) && (bVar15 = uVar9 < 7, uVar9 = uVar9 + 1, bVar15));
            sVar10 = sVar11;
          } while (sVar11 != 8);
        }
        bVar16 = false;
      }
      goto LAB_00638831;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar16 = uVar9 - 8 <= uVar13;
    uVar13 = uVar13 + 1;
    if (bVar16) break;
LAB_006388ac:
    InstanceIntersectorK<4>::occluded(local_34e8,&valid0,&pre,ray,context,prim);
    auVar18 = auVar32._0_16_;
    aVar4.v = (__m128)vandnps_avx((undefined1  [16])local_34e8,valid0.field_0);
    auVar29 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_34e8;
    valid0.field_0 = aVar4;
    if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf])
    break;
  }
LAB_00638900:
  auVar18 = vpcmpeqd_avx(auVar18,auVar18);
  auVar32 = ZEXT1664(auVar18);
  local_3598 = vpor_avx(local_3598,auVar18 ^ (undefined1  [16])valid0.field_0);
  auVar18 = auVar18 & ~local_3598;
  if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar18 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar18 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar18[0xf]) {
    auVar33 = ZEXT1664(auVar33._0_16_);
    auVar34 = ZEXT1664(auVar20);
    auVar36 = ZEXT1664(auVar35);
    auVar37 = ZEXT1664(auVar23);
    auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar40 = ZEXT1664(auVar39);
    bVar16 = true;
  }
  else {
    auVar18._8_4_ = 0xff800000;
    auVar18._0_8_ = 0xff800000ff800000;
    auVar18._12_4_ = 0xff800000;
    bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   vblendvps_avx((undefined1  [16])bi_8.field_0,auVar18,local_3598);
    bVar16 = false;
    auVar33 = ZEXT1664(auVar33._0_16_);
    auVar34 = ZEXT1664(auVar20);
    auVar36 = ZEXT1664(auVar35);
    auVar37 = ZEXT1664(auVar23);
    auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar40 = ZEXT1664(auVar39);
  }
LAB_00638831:
  if (bVar16) {
    auVar5 = vandps_avx(auVar33._0_16_,local_3598);
    auVar21._8_4_ = 0xff800000;
    auVar21._0_8_ = 0xff800000ff800000;
    auVar21._12_4_ = 0xff800000;
    auVar5 = vmaskmovps_avx(auVar5,auVar21);
    *(undefined1 (*) [16])(ray + 0x80) = auVar5;
    return;
  }
  goto LAB_006386d4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }